

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O3

opStatus __thiscall llvm::APFloat::subtract(APFloat *this,APFloat *RHS,roundingMode RM)

{
  Storage *this_00;
  opStatus oVar1;
  DoubleAPFloat *this_01;
  
  if ((this->U).semantics != (RHS->U).semantics) {
    __assert_fail("&getSemantics() == &RHS.getSemantics() && \"Should only call on two APFloats with the same semantics\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                  ,0x3b8,"opStatus llvm::APFloat::subtract(const APFloat &, roundingMode)");
  }
  this_00 = &this->U;
  if ((this->U).semantics != (fltSemantics *)semPPCDoubleDouble) {
    oVar1 = detail::IEEEFloat::addOrSubtract(&this_00->IEEE,&(RHS->U).IEEE,RM,true);
    return oVar1;
  }
  changeSign((APFloat *)(this->U).IEEE.significand.parts);
  this_01 = (DoubleAPFloat *)((this->U).IEEE.significand.part + 0x20);
  changeSign((APFloat *)this_01);
  oVar1 = detail::DoubleAPFloat::addWithSpecial
                    (this_01,(DoubleAPFloat *)&this_00->IEEE,(DoubleAPFloat *)&(RHS->U).IEEE,
                     (DoubleAPFloat *)&this_00->IEEE,RM);
  changeSign((APFloat *)(this->U).IEEE.significand.parts);
  changeSign((APFloat *)((this->U).IEEE.significand.part + 0x20));
  return oVar1;
}

Assistant:

const fltSemantics &getSemantics() const { return *U.semantics; }